

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

const_iterator * __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
::begin(const_iterator *__return_storage_ptr__,
       parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
       *this)

{
  iterator i;
  iterator local_40;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  *local_10;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  *this_local;
  
  local_10 = this;
  begin(&local_40,this);
  i.inner_end_ = local_40.inner_end_;
  i.inner_ = local_40.inner_;
  i.it_.ctrl_ = local_40.it_.ctrl_;
  i.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_40.it_.field_1.slot_;
  i.it_end_.ctrl_ = local_40.it_end_.ctrl_;
  i.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_40.it_end_.field_1.slot_;
  const_iterator::const_iterator(__return_storage_ptr__,i);
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin()  const { return const_cast<parallel_hash_set *>(this)->begin(); }